

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_node __thiscall pugi::xpath_query::evaluate_node(xpath_query *this,xpath_node *n)

{
  xpath_ast_node *this_00;
  bad_alloc *this_01;
  xpath_node xVar1;
  undefined1 local_20d8 [8];
  xpath_node_set_raw r;
  xpath_stack_data sd;
  xpath_context c;
  xpath_ast_node *root;
  xpath_node *n_local;
  xpath_query *this_local;
  xml_attribute local_10;
  
  this_00 = impl::anon_unknown_0::evaluate_node_set_prepare((xpath_query_impl *)this->_impl);
  if (this_00 == (xpath_ast_node *)0x0) {
    xpath_node::xpath_node((xpath_node *)&this_local);
  }
  else {
    impl::anon_unknown_0::xpath_context::xpath_context((xpath_context *)&sd.oom,n,1,1);
    impl::anon_unknown_0::xpath_stack_data::xpath_stack_data((xpath_stack_data *)&r._eos);
    impl::anon_unknown_0::xpath_ast_node::eval_node_set
              ((xpath_node_set_raw *)local_20d8,this_00,(xpath_context *)&sd.oom,
               (xpath_stack *)&sd.temp._error,nodeset_eval_first);
    if (((byte)sd.stack.temp & 1) != 0) {
      this_01 = (bad_alloc *)__cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(this_01);
      __cxa_throw(this_01,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    xVar1 = impl::anon_unknown_0::xpath_node_set_raw::first((xpath_node_set_raw *)local_20d8);
    local_10 = xVar1._attribute._attr;
    this_local = (xpath_query *)xVar1._node._root;
    impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data((xpath_stack_data *)&r._eos);
  }
  xVar1._attribute._attr = local_10._attr;
  xVar1._node._root = (xml_node_struct *)this_local;
  return xVar1;
}

Assistant:

PUGI__FN xpath_node xpath_query::evaluate_node(const xpath_node& n) const
	{
		impl::xpath_ast_node* root = impl::evaluate_node_set_prepare(static_cast<impl::xpath_query_impl*>(_impl));
		if (!root) return xpath_node();

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		impl::xpath_node_set_raw r = root->eval_node_set(c, sd.stack, impl::nodeset_eval_first);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return xpath_node();
		#else
			throw std::bad_alloc();
		#endif
		}

		return r.first();
	}